

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O3

void __thiscall musicBlock::OPLplayMusic(musicBlock *this,int vol)

{
  uchar *puVar1;
  long lVar2;
  undefined4 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 auVar4 [16];
  
  uVar7 = (undefined1)((uint)vol >> 0x18);
  uVar6 = (undefined1)((uint)vol >> 0x10);
  uVar5 = (undefined1)((uint)vol >> 8);
  auVar4._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar7,uVar7),uVar6),CONCAT14(uVar6,vol)) >> 0x20);
  auVar4[3] = uVar5;
  auVar4[2] = uVar5;
  auVar4[0] = (undefined1)vol;
  auVar4[1] = auVar4[0];
  auVar4._8_8_ = 0;
  auVar4 = pshuflw(auVar4,auVar4,0);
  uVar3 = auVar4._0_4_;
  *(undefined4 *)(this->driverdata).channelVolume = uVar3;
  *(undefined4 *)((this->driverdata).channelVolume + 4) = uVar3;
  *(undefined4 *)((this->driverdata).channelVolume + 8) = uVar3;
  *(undefined4 *)((this->driverdata).channelVolume + 0xc) = uVar3;
  builtin_memcpy((this->driverdata).channelLastVolume,"@@@@@@@@@@@@@@@@",0x10);
  builtin_memcpy((this->driverdata).channelPitch,"@@@@@@@@@@@@@@@@",0x10);
  lVar2 = -0x10;
  do {
    *(undefined1 *)((long)this->channels + lVar2 + -0x1c) = 0x7f;
    (this->driverdata).channelModulation[lVar2] = '\0';
    puVar1 = (this->driverdata).channelExpression + lVar2 * 2;
    puVar1[0] = 0xff;
    puVar1[1] = '?';
    (this->driverdata).channelRPN[lVar2] = 200;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

void musicBlock::OPLresetControllers(uint chan, int vol)
{
	driverdata.channelVolume[chan] = vol;
	driverdata.channelExpression[chan] = 127;
	driverdata.channelSustain[chan] = 0;
	driverdata.channelLastVolume[chan] = 64;
	driverdata.channelPitch[chan] = 64;
	driverdata.channelRPN[chan] = 0x3fff;
	driverdata.channelPitchSens[chan] = 200;
}